

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O2

bool __thiscall
duckdb::PerfectHashJoinExecutor::TemplatedFillSelectionVectorBuild<unsigned_char>
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *sel_vec,
          SelectionVector *seq_sel_vec,idx_t count)

{
  byte bVar1;
  sel_t *psVar2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  sel_t *psVar4;
  byte bVar5;
  byte bVar6;
  idx_t iVar7;
  idx_t i;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  UnifiedVectorFormat vector_data;
  UnifiedVectorFormat local_78;
  
  if (((this->perfect_join_statistics).build_min.is_null == false) &&
     ((this->perfect_join_statistics).build_max.is_null == false)) {
    bVar5 = Value::GetValueUnsafe<unsigned_char>(&(this->perfect_join_statistics).build_min);
    bVar6 = Value::GetValueUnsafe<unsigned_char>(&(this->perfect_join_statistics).build_max);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(source,count,&local_78);
    psVar2 = sel_vec->sel_vector;
    _Var3._M_head_impl =
         (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    iVar7 = this->unique_keys;
    psVar4 = seq_sel_vec->sel_vector;
    lVar9 = 0;
    for (uVar8 = 0; count != uVar8; uVar8 = uVar8 + 1) {
      uVar10 = uVar8;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)(local_78.sel)->sel_vector[uVar8];
      }
      bVar1 = local_78.data[uVar10];
      if ((bVar5 <= bVar1) && (bVar1 <= bVar6)) {
        lVar11 = (ulong)bVar1 - (ulong)bVar5;
        psVar2[lVar9] = (sel_t)lVar11;
        if (_Var3._M_head_impl[lVar11] != false) break;
        _Var3._M_head_impl[lVar11] = true;
        iVar7 = iVar7 + 1;
        this->unique_keys = iVar7;
        psVar4[lVar9] = (sel_t)uVar8;
        lVar9 = lVar9 + 1;
      }
    }
    bVar12 = count <= uVar8;
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  else {
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool PerfectHashJoinExecutor::TemplatedFillSelectionVectorBuild(Vector &source, SelectionVector &sel_vec,
                                                                SelectionVector &seq_sel_vec, idx_t count) {
	if (perfect_join_statistics.build_min.IsNull() || perfect_join_statistics.build_max.IsNull()) {
		return false;
	}
	auto min_value = perfect_join_statistics.build_min.GetValueUnsafe<T>();
	auto max_value = perfect_join_statistics.build_max.GetValueUnsafe<T>();
	UnifiedVectorFormat vector_data;
	source.ToUnifiedFormat(count, vector_data);
	auto data = reinterpret_cast<T *>(vector_data.data);
	// generate the selection vector
	for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
		auto data_idx = vector_data.sel->get_index(i);
		auto input_value = data[data_idx];
		// add index to selection vector if value in the range
		if (min_value <= input_value && input_value <= max_value) {
			auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
			sel_vec.set_index(sel_idx, idx);
			if (bitmap_build_idx[idx]) {
				return false;
			} else {
				bitmap_build_idx[idx] = true;
				unique_keys++;
			}
			seq_sel_vec.set_index(sel_idx++, i);
		}
	}
	return true;
}